

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O3

int absl::strings_internal::memcasecmp(char *s1,char *s2,size_t len)

{
  size_t sVar1;
  
  if (len != 0) {
    sVar1 = 0;
    do {
      if ((uint)(byte)ascii_internal::kToLower[(byte)s1[sVar1]] -
          (uint)(byte)ascii_internal::kToLower[(byte)s2[sVar1]] != 0) {
        return (uint)(byte)ascii_internal::kToLower[(byte)s1[sVar1]] -
               (uint)(byte)ascii_internal::kToLower[(byte)s2[sVar1]];
      }
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
  }
  return 0;
}

Assistant:

int memcasecmp(const char* s1, const char* s2, size_t len) {
  const unsigned char* us1 = reinterpret_cast<const unsigned char*>(s1);
  const unsigned char* us2 = reinterpret_cast<const unsigned char*>(s2);

  for (size_t i = 0; i < len; i++) {
    const int diff =
        int{static_cast<unsigned char>(absl::ascii_tolower(us1[i]))} -
        int{static_cast<unsigned char>(absl::ascii_tolower(us2[i]))};
    if (diff != 0) return diff;
  }
  return 0;
}